

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

float __thiscall
baryonyx::itm::quadratic_cost_type<float>::min(quadratic_cost_type<float> *this,int n)

{
  float *pfVar1;
  quad *pqVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (n == 0) {
    auVar8 = ZEXT464(0x7f7fffff);
  }
  else {
    auVar8 = ZEXT464(0x7f7fffff);
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    uVar6 = 0;
    do {
      pfVar1 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar6;
      uVar6 = uVar6 + 1;
      auVar11 = ZEXT416((uint)*pfVar1);
      auVar10 = vandps_avx(auVar11,auVar9);
      uVar3 = vcmpps_avx512vl(auVar11,ZEXT816(0) << 0x40,4);
      uVar4 = vcmpps_avx512vl(auVar10,auVar8._0_16_,1);
      bVar5 = (byte)uVar3 & (byte)uVar4;
      auVar8 = ZEXT1664(CONCAT124(auVar8._4_12_,
                                  (uint)(bVar5 & 1) * auVar10._0_4_ +
                                  (uint)!(bool)(bVar5 & 1) * auVar8._0_4_));
    } while ((uint)n != uVar6);
  }
  uVar6 = (ulong)(uint)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                       _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[n];
  if (uVar6 != 0) {
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    uVar7 = 0;
    do {
      pqVar2 = (this->quadratic_elements)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
               .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
               _M_head_impl + uVar7;
      uVar7 = uVar7 + 1;
      auVar11 = ZEXT416((uint)pqVar2->factor);
      auVar9 = vandps_avx(auVar11,auVar10);
      uVar3 = vcmpps_avx512vl(auVar11,ZEXT816(0) << 0x40,4);
      uVar4 = vcmpps_avx512vl(auVar9,auVar8._0_16_,1);
      bVar5 = (byte)uVar3 & (byte)uVar4;
      auVar8 = ZEXT1664(CONCAT124(auVar8._4_12_,
                                  (uint)(bVar5 & 1) * auVar9._0_4_ +
                                  (uint)!(bool)(bVar5 & 1) * auVar8._0_4_));
    } while (uVar6 != uVar7);
  }
  return auVar8._0_4_;
}

Assistant:

Float min(int n) const noexcept
    {
        Float min = std::numeric_limits<Float>::max();

        for (int i = 0; i != n; ++i)
            if (linear_elements[i])
                min = std::min(min, std::abs(linear_elements[i]));

        for (int i = 0, e = indices[n]; i != e; ++i)
            if (quadratic_elements[i].factor)
                min = std::min(min, std::abs(quadratic_elements[i].factor));

        return min;
    }